

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint32 * rw::ps2::instanceUV(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  uint uVar1;
  ushort uVar2;
  TexCoords *pTVar3;
  uint16 *puVar4;
  ulong uVar5;
  
  uVar1 = n + idx;
  if ((g->flags & 0x84) == 0) {
    if (idx < uVar1) {
      memset(p,0,(ulong)(n - 1) * 8 + 8);
      p = p + (ulong)(n - 1) * 2 + 2;
    }
  }
  else if (idx < uVar1) {
    pTVar3 = g->texCoords[0];
    puVar4 = m->indices;
    uVar5 = (ulong)idx;
    do {
      uVar2 = puVar4[uVar5];
      *p = (uint32)pTVar3[uVar2].u;
      ((float32 *)p)[1] = pTVar3[uVar2].v;
      p = (uint32 *)((float32 *)p + 2);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (((ulong)p & 0xf) != 0) {
    uVar5 = (ulong)(0xcU - (int)p & 0xc);
    memset(p,0,uVar5 + 4);
    p = (uint32 *)((long)p + uVar5 + 4);
  }
  return (uint32 *)(float32 *)p;
}

Assistant:

uint32*
instanceUV(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->texCoords[0];
	if((g->flags & Geometry::TEXTURED) ||
	   (g->flags & Geometry::TEXTURED2))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j*2+0];
			*p++ = d[j*2+1];
		}
	else
		for(uint32 i = idx; i < idx+n; i++){
			*p++ = 0;
			*p++ = 0;
		}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}